

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbeContainer.cpp
# Opt level: O0

void __thiscall Js::ProbeContainer::DispatchDOMMutationBreakpoint(ProbeContainer *this)

{
  bool bVar1;
  anon_class_24_3_6ca8ab11 local_c8;
  anon_class_24_3_63f909af local_b0;
  int local_94;
  undefined1 auStack_90 [4];
  int currentOffset;
  undefined1 local_50 [8];
  InterpreterHaltState haltState;
  ProbeContainer *this_local;
  
  haltState.activeMutationBP = (MutationBreakpoint *)this;
  InterpreterHaltState::InterpreterHaltState
            ((InterpreterHaltState *)local_50,STOP_DOMMUTATIONBREAKPOINT,(FunctionBody *)0x0,
             (MutationBreakpoint *)0x0);
  memcpy(auStack_90,local_50,0x40);
  Output::Trace(DebuggerPhase,
                L"ProbeContainer::DispatchDOMMutationBreakpoint: start: this=%p, pHaltState=%p\n",
                this);
  bVar1 = CanDispatchHalt(this,(InterpreterHaltState *)local_50);
  if (bVar1) {
    local_94 = -1;
    local_b0.haltState = (InterpreterHaltState *)local_50;
    local_b0.currentOffset = &local_94;
    local_c8.currentOffset = &local_94;
    local_c8.haltState = (InterpreterHaltState *)local_50;
    local_c8.this = this;
    local_b0.this = this;
    TryFinally<Js::ProbeContainer::DispatchDOMMutationBreakpoint()::__0,Js::ProbeContainer::DispatchDOMMutationBreakpoint()::__1>
              (&local_b0,&local_c8);
  }
  return;
}

Assistant:

void ProbeContainer::DispatchDOMMutationBreakpoint()
    {
        InterpreterHaltState haltState(STOP_DOMMUTATIONBREAKPOINT, /*_executingFunction*/nullptr);
        OUTPUT_TRACE(Js::DebuggerPhase, _u("ProbeContainer::DispatchDOMMutationBreakpoint: start: this=%p, pHaltState=%p\n"), this, haltState);
        if (!CanDispatchHalt(&haltState))
        {
            return;
        }

        int currentOffset = -1;
        TryFinally([&]()
        {
            InitializeLocation(&haltState);
            OUTPUT_TRACE(Js::DebuggerPhase, _u("ProbeContainer::DispatchDOMMutationBreakpoint: initialized location: pHaltState=%p, pHaltState->IsValid()=%d\n"),
                haltState, haltState.IsValid());

            if (haltState.IsValid())
            {
                if (haltState.topFrame->IsInterpreterFrame())
                {
                    currentOffset = haltState.GetCurrentOffset();
                    Assert(currentOffset > 0);
                    haltState.SetCurrentOffset(currentOffset - 1);
                }
                debugManager->stepController.Deactivate(&haltState);
                debugManager->asyncBreakController.Deactivate();

                haltState.GetFunction()->CheckAndRegisterFuncToDiag(pScriptContext);

                Assert(haltState.GetFunction()->GetScriptContext() == pScriptContext);

                haltCallbackProbe->DispatchHalt(&haltState);
            }
        },
            [&](bool)
        {
            // Restore the current offset;
            if (currentOffset != -1 && haltState.topFrame->IsInterpreterFrame())
            {
                haltState.SetCurrentOffset(currentOffset);
            }
            DestroyLocation();
        });
    }